

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O0

void __thiscall FlowGraph::RunPeeps(FlowGraph *this)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  BOOL BVar4;
  uint sourceContextId;
  uint functionId;
  int32 iVar5;
  BranchInstr *pBVar6;
  LabelInstr *pLVar7;
  Instr *instr_00;
  Opnd *pOVar8;
  RegOpnd *pRVar9;
  undefined4 *puVar10;
  Instr *local_38;
  Instr *instr;
  Instr *instrStop;
  Instr *instrNext;
  Instr *pIStack_18;
  bool tryUnsignedCmpPeep;
  Instr *instrCm;
  FlowGraph *this_local;
  
  BVar4 = Func::HasTry(this->func);
  if (BVar4 == 0) {
    sourceContextId = Func::GetSourceContextId(this->func);
    functionId = Func::GetLocalFunctionId(this->func);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,FGPeepsPhase,sourceContextId,functionId);
    if (!bVar2) {
      pIStack_18 = (Instr *)0x0;
      bVar2 = false;
      local_38 = this->func->m_headInstr;
      while (local_38 != (Instr *)0x0) {
        instrStop = local_38->m_next;
        switch(*(int *)&local_38->m_opcode - 9U & 0xffff) {
        case 0:
        case 1:
        case 2:
        case 3:
        case 4:
        case 7:
        case 8:
        case 9:
        case 10:
        case 0xb:
        case 0xc:
        case 0xd:
        case 0xf:
        case 0x10:
        case 0x11:
        case 0xdd:
        case 0xf9:
        case 0xfa:
        case 0xfd:
        case 0x113:
        case 0x114:
        case 0x115:
        case 0x183:
        case 0x184:
        case 0x185:
        case 0x186:
        case 0x187:
        case 0x188:
        case 0x189:
        case 0x18b:
        case 0x18c:
        case 0x18d:
        case 0x18e:
        case 399:
        case 400:
        case 0x191:
        case 0x192:
        case 0x193:
        case 0x194:
        case 0x19c:
        case 0x19f:
        case 0x1a0:
        case 0x1a1:
        case 0x1a2:
        case 0x1a3:
        case 0x1a4:
        case 0x1a5:
        case 0x1a6:
        case 0x1a7:
        case 0x217:
        case 0x279:
        case 0x27a:
          if (bVar2) {
            UnsignedCmpPeep(this,local_38);
          }
          pBVar6 = IR::Instr::AsBranchInstr(local_38);
          instrStop = Peeps::PeepBranch(pBVar6,(bool *)0x0);
          break;
        case 5:
        case 6:
        case 0x19d:
        case 0x19e:
          if (pIStack_18 == (Instr *)0x0) {
            pBVar6 = IR::Instr::AsBranchInstr(local_38);
            instrStop = Peeps::PeepBranch(pBVar6,(bool *)0x0);
          }
          else {
            pOVar8 = IR::Instr::GetDst(pIStack_18);
            bVar3 = IR::Opnd::IsInt32(pOVar8);
            if (bVar3) {
              if ((local_38->m_opcode != BrTrue_I4) && (local_38->m_opcode != BrFalse_I4)) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar10 = 1;
                bVar3 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                                   ,0x369,
                                   "(instr->m_opcode == Js::OpCode::BrTrue_I4 || instr->m_opcode == Js::OpCode::BrFalse_I4)"
                                   ,
                                   "instr->m_opcode == Js::OpCode::BrTrue_I4 || instr->m_opcode == Js::OpCode::BrFalse_I4"
                                  );
                if (!bVar3) {
                  pcVar1 = (code *)invalidInstructionException();
                  (*pcVar1)();
                }
                puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar10 = 0;
              }
              instrStop = PeepTypedCm(this,pIStack_18);
            }
            else {
              instrStop = PeepCm(this,pIStack_18);
            }
            pIStack_18 = (Instr *)0x0;
            if (instrStop == (Instr *)0x0) {
              instrStop = local_38;
            }
          }
          break;
        default:
          bVar3 = IR::Instr::IsBranchInstr(local_38);
          if (bVar3) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar10 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                               ,0x3b7,"(!instr->IsBranchInstr())","!instr->IsBranchInstr()");
            if (!bVar3) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar10 = 0;
          }
          break;
        case 0x31:
        case 0x1c3:
          if (!bVar2) {
            pOVar8 = IR::Instr::GetDst(local_38);
            pRVar9 = IR::Opnd::AsRegOpnd(pOVar8);
            bVar3 = StackSym::IsSingleDef(pRVar9->m_sym);
            if (bVar3) {
              pOVar8 = IR::Instr::GetSrc2(local_38);
              bVar3 = IR::Opnd::IsRegOpnd(pOVar8);
              if (bVar3) {
                pOVar8 = IR::Instr::GetSrc2(local_38);
                pRVar9 = IR::Opnd::AsRegOpnd(pOVar8);
                bVar3 = StackSym::IsTaggableIntConst(pRVar9->m_sym);
                if (bVar3) {
                  pOVar8 = IR::Instr::GetSrc2(local_38);
                  pRVar9 = IR::Opnd::AsRegOpnd(pOVar8);
                  iVar5 = StackSym::GetIntConstValue(pRVar9->m_sym);
                  if (iVar5 == 0) {
                    bVar2 = true;
                  }
                }
              }
            }
          }
          break;
        case 0x32:
        case 0x33:
        case 0x34:
        case 0x35:
        case 0x36:
        case 0x37:
        case 0x38:
        case 0x39:
        case 0x1ca:
        case 0x1cb:
        case 0x1cc:
        case 0x1cd:
        case 0x1ce:
        case 0x1cf:
          if (bVar2) {
            UnsignedCmpPeep(this,local_38);
          }
        case 0x1c6:
        case 0x1c7:
        case 0x1c8:
        case 0x1c9:
        case 0x1d0:
        case 0x1d1:
        case 0x1d2:
        case 0x1d3:
          pIStack_18 = local_38;
          break;
        case 0x16d:
          pLVar7 = IR::Instr::AsLabelInstr(local_38);
          BVar4 = IR::LabelInstr::IsUnreferenced(pLVar7);
          if (BVar4 != 0) {
            pLVar7 = IR::Instr::AsLabelInstr(local_38);
            instrStop = Peeps::PeepUnreachableLabel(pLVar7,false,(bool *)0x0);
          }
          break;
        case 0x170:
          IR::Instr::ClearByteCodeOffset(local_38);
          instr_00 = IR::Instr::GetNextRealInstrOrLabel(local_38);
          IR::Instr::SetByteCodeOffset(local_38,instr_00);
          break;
        case 0x182:
        }
        local_38 = instrStop;
      }
    }
  }
  return;
}

Assistant:

void
FlowGraph::RunPeeps()
{
    if (this->func->HasTry())
    {
        return;
    }

    if (PHASE_OFF(Js::FGPeepsPhase, this->func))
    {
        return;
    }

    IR::Instr * instrCm = nullptr;
    bool tryUnsignedCmpPeep = false;

    FOREACH_INSTR_IN_FUNC_EDITING(instr, instrNext, this->func)
    {
        switch(instr->m_opcode)
        {
        case Js::OpCode::Br:
        case Js::OpCode::BrEq_I4:
        case Js::OpCode::BrGe_I4:
        case Js::OpCode::BrGt_I4:
        case Js::OpCode::BrLt_I4:
        case Js::OpCode::BrLe_I4:
        case Js::OpCode::BrUnGe_I4:
        case Js::OpCode::BrUnGt_I4:
        case Js::OpCode::BrUnLt_I4:
        case Js::OpCode::BrUnLe_I4:
        case Js::OpCode::BrNeq_I4:
        case Js::OpCode::BrEq_A:
        case Js::OpCode::BrGe_A:
        case Js::OpCode::BrGt_A:
        case Js::OpCode::BrLt_A:
        case Js::OpCode::BrLe_A:
        case Js::OpCode::BrUnGe_A:
        case Js::OpCode::BrUnGt_A:
        case Js::OpCode::BrUnLt_A:
        case Js::OpCode::BrUnLe_A:
        case Js::OpCode::BrNotEq_A:
        case Js::OpCode::BrNotNeq_A:
        case Js::OpCode::BrSrNotEq_A:
        case Js::OpCode::BrSrNotNeq_A:
        case Js::OpCode::BrNotGe_A:
        case Js::OpCode::BrNotGt_A:
        case Js::OpCode::BrNotLt_A:
        case Js::OpCode::BrNotLe_A:
        case Js::OpCode::BrNeq_A:
        case Js::OpCode::BrNotNull_A:
        case Js::OpCode::BrNotAddr_A:
        case Js::OpCode::BrAddr_A:
        case Js::OpCode::BrSrEq_A:
        case Js::OpCode::BrSrNeq_A:
        case Js::OpCode::BrOnHasProperty:
        case Js::OpCode::BrOnNoProperty:
        case Js::OpCode::BrOnHasLocalProperty:
        case Js::OpCode::BrOnNoLocalProperty:
        case Js::OpCode::BrHasSideEffects:
        case Js::OpCode::BrNotHasSideEffects:
        case Js::OpCode::BrFncEqApply:
        case Js::OpCode::BrFncNeqApply:
        case Js::OpCode::BrOnEmpty:
        case Js::OpCode::BrOnNotEmpty:
        case Js::OpCode::BrFncCachedScopeEq:
        case Js::OpCode::BrFncCachedScopeNeq:
        case Js::OpCode::BrOnObject_A:
        case Js::OpCode::BrOnClassConstructor:
        case Js::OpCode::BrOnBaseConstructorKind:
        case Js::OpCode::BrOnObjectOrNull_A:
        case Js::OpCode::BrOnNotNullObj_A:
        case Js::OpCode::BrOnConstructor_A:
            if (tryUnsignedCmpPeep)
            {
                this->UnsignedCmpPeep(instr);
            }
            instrNext = Peeps::PeepBranch(instr->AsBranchInstr());
            break;

        case Js::OpCode::MultiBr:
            // TODO: Run peeps on these as well...
            break;

        case Js::OpCode::BrTrue_I4:
        case Js::OpCode::BrFalse_I4:
        case Js::OpCode::BrTrue_A:
        case Js::OpCode::BrFalse_A:
            if (instrCm)
            {
                if (instrCm->GetDst()->IsInt32())
                {
                    Assert(instr->m_opcode == Js::OpCode::BrTrue_I4 || instr->m_opcode == Js::OpCode::BrFalse_I4);
                    instrNext = this->PeepTypedCm(instrCm);
                }
                else
                {
                    instrNext = this->PeepCm(instrCm);
                }
                instrCm = nullptr;

                if (instrNext == nullptr)
                {
                    // Set instrNext back to the current instr.
                    instrNext = instr;
                }
            }
            else
            {
                instrNext = Peeps::PeepBranch(instr->AsBranchInstr());
            }
            break;

        case Js::OpCode::CmEq_I4:
        case Js::OpCode::CmGe_I4:
        case Js::OpCode::CmGt_I4:
        case Js::OpCode::CmLt_I4:
        case Js::OpCode::CmLe_I4:
        case Js::OpCode::CmNeq_I4:
        case Js::OpCode::CmEq_A:
        case Js::OpCode::CmGe_A:
        case Js::OpCode::CmGt_A:
        case Js::OpCode::CmLt_A:
        case Js::OpCode::CmLe_A:
        case Js::OpCode::CmNeq_A:
        case Js::OpCode::CmSrEq_A:
        case Js::OpCode::CmSrNeq_A:
            if (tryUnsignedCmpPeep)
            {
                this->UnsignedCmpPeep(instr);
            }
        case Js::OpCode::CmUnGe_I4:
        case Js::OpCode::CmUnGt_I4:
        case Js::OpCode::CmUnLt_I4:
        case Js::OpCode::CmUnLe_I4:
        case Js::OpCode::CmUnGe_A:
        case Js::OpCode::CmUnGt_A:
        case Js::OpCode::CmUnLt_A:
        case Js::OpCode::CmUnLe_A:
            // There may be useless branches between the Cm instr and the branch that uses the result.
            // So save the last Cm instr seen, and trigger the peep on the next BrTrue/BrFalse.
            instrCm = instr;
            break;

        case Js::OpCode::Label:
            if (instr->AsLabelInstr()->IsUnreferenced())
            {
                instrNext = Peeps::PeepUnreachableLabel(instr->AsLabelInstr(), false);
            }
            break;

        case Js::OpCode::StatementBoundary:
            instr->ClearByteCodeOffset();
            instr->SetByteCodeOffset(instr->GetNextRealInstrOrLabel());
            break;

        case Js::OpCode::ShrU_I4:
        case Js::OpCode::ShrU_A:
            if (tryUnsignedCmpPeep)
            {
                break;
            }
            if (instr->GetDst()->AsRegOpnd()->m_sym->IsSingleDef()
                && instr->GetSrc2()->IsRegOpnd() && instr->GetSrc2()->AsRegOpnd()->m_sym->IsTaggableIntConst()
                && instr->GetSrc2()->AsRegOpnd()->m_sym->GetIntConstValue() == 0)
            {
                tryUnsignedCmpPeep = true;
            }
            break;
        default:
            Assert(!instr->IsBranchInstr());
        }
   } NEXT_INSTR_IN_FUNC_EDITING;
}